

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_deserialize(void *buf)

{
  uint uVar1;
  char *in_RDI;
  uint32_t elem;
  uint32_t i;
  roaring_bulk_context_t context;
  roaring_bitmap_t *bitmap;
  uint32_t *elems;
  uint32_t card;
  char *bufaschar;
  uint uVar2;
  roaring_bitmap_t *in_stack_ffffffffffffffc0;
  roaring_bitmap_t *local_8;
  
  if (*in_RDI == '\x01') {
    uVar1 = *(uint *)(in_RDI + 1);
    local_8 = roaring_bitmap_create();
    if (local_8 == (roaring_bitmap_t *)0x0) {
      local_8 = (roaring_bitmap_t *)0x0;
    }
    else {
      memset(&stack0xffffffffffffffc0,0,0x10);
      for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
        roaring_bitmap_add_bulk
                  (in_stack_ffffffffffffffc0,
                   (roaring_bulk_context_t *)
                   CONCAT44(uVar2,*(undefined4 *)(in_RDI + (ulong)uVar2 * 4 + 5)),0);
      }
    }
  }
  else if (*in_RDI == '\x02') {
    local_8 = roaring_bitmap_portable_deserialize((char *)0x10c19a);
  }
  else {
    local_8 = (roaring_bitmap_t *)0x0;
  }
  return local_8;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_deserialize(const void *buf) {
    const char *bufaschar = (const char *)buf;
    if (bufaschar[0] == CROARING_SERIALIZATION_ARRAY_UINT32) {
        /* This looks like a compressed set of uint32_t elements */
        uint32_t card;

        memcpy(&card, bufaschar + 1, sizeof(uint32_t));

        const uint32_t *elems =
            (const uint32_t *)(bufaschar + 1 + sizeof(uint32_t));

        roaring_bitmap_t *bitmap = roaring_bitmap_create();
        if (bitmap == NULL) {
            return NULL;
        }
        roaring_bulk_context_t context = {0};
        for (uint32_t i = 0; i < card; i++) {
            // elems may not be aligned, read with memcpy
            uint32_t elem;
            memcpy(&elem, elems + i, sizeof(elem));
            roaring_bitmap_add_bulk(bitmap, &context, elem);
        }
        return bitmap;

    } else if (bufaschar[0] == CROARING_SERIALIZATION_CONTAINER) {
        return roaring_bitmap_portable_deserialize(bufaschar + 1);
    } else
        return (NULL);
}